

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O0

optional_ptr<duckdb::SchemaCatalogEntry,_true> __thiscall
duckdb::CatalogEntryRetriever::GetSchema
          (CatalogEntryRetriever *this,string *catalog,EntryLookupInfo *schema_lookup_p,
          OnEntryNotFound on_entry_not_found)

{
  bool bVar1;
  undefined1 in_CL;
  optional_ptr<duckdb::BoundAtClause,_true> in_RDX;
  CatalogEntry *in_RDI;
  EntryLookupInfo schema_lookup;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> result;
  OnEntryNotFound in_stack_000000c7;
  EntryLookupInfo *in_stack_000000c8;
  string *in_stack_000000d0;
  CatalogEntryRetriever *in_stack_000000d8;
  function<void_(duckdb::CatalogEntry_&)> *this_00;
  EntryLookupInfo *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  SchemaCatalogEntry *local_8;
  
  this_00 = *(function<void_(duckdb::CatalogEntry_&)> **)((long)&(in_RDI->name).field_2 + 8);
  EntryLookupInfo::EntryLookupInfo
            ((EntryLookupInfo *)CONCAT17(in_CL,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
             in_RDX);
  local_8 = (SchemaCatalogEntry *)
            Catalog::GetSchema(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                               in_stack_000000c7);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_8);
  if ((bVar1) && (bVar1 = ::std::function::operator_cast_to_bool(this_00), bVar1)) {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator*
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)this_00);
    ::std::function<void_(duckdb::CatalogEntry_&)>::operator()(this_00,in_RDI);
  }
  return (optional_ptr<duckdb::SchemaCatalogEntry,_true>)local_8;
}

Assistant:

optional_ptr<SchemaCatalogEntry> CatalogEntryRetriever::GetSchema(const string &catalog,
                                                                  const EntryLookupInfo &schema_lookup_p,
                                                                  OnEntryNotFound on_entry_not_found) {
	EntryLookupInfo schema_lookup(schema_lookup_p, at_clause);
	auto result = Catalog::GetSchema(*this, catalog, schema_lookup, on_entry_not_found);
	if (!result) {
		return result;
	}
	if (callback) {
		// Call the callback if it's set
		callback(*result);
	}
	return result;
}